

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBPACEStep3(octet *out,octet *in,void *state)

{
  bool_t bVar1;
  void *src;
  ec_o *in_RDX;
  word *in_RSI;
  word *in_RDI;
  void *stack;
  word *Va;
  size_t no;
  size_t n;
  bake_bpace_o *s;
  void *in_stack_ffffffffffffffb8;
  void *dest;
  octet *key;
  octet *X;
  ec_o *W;
  
  W = in_RDX;
  bVar1 = objIsOperable(in_stack_ffffffffffffffb8);
  if (bVar1 != 0) {
    X = (octet *)in_RDX->f->mod[6];
    key = (octet *)in_RDX->f->mod[7];
    bVar1 = memIsValid(in_RSI,(ulong)key >> 1);
    if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,(ulong)((long)key * 5) >> 1), bVar1 != 0)) {
      dest = (void *)((long)&(in_RDX->hdr).keep + (in_RDX->hdr).keep);
      src = (void *)((long)dest + (long)X * 0x10);
      memCopy(dest,src,0x1207b1);
      beltECBStart(X,key,(size_t)dest);
      beltECBStepD(X,(size_t)key,dest);
      (*in_RDX->toa)(in_RDI,(word *)((ulong)key >> 1),(ec_o *)in_RDX->neg,in_RDX);
      memCopy(dest,src,0x12082c);
      beltECBStart(X,key,(size_t)dest);
      beltECBStepE(X,(size_t)key,dest);
      bakeSWU2((word *)W,in_RDX,X,key);
      bVar1 = zzRandNZMod(in_RDI,in_RSI,(size_t)W,(gen_i)in_RDX,X);
      if (bVar1 == 0) {
        return 0x130;
      }
      bVar1 = ecMulA((word *)state,(word *)s,(ec_o *)n,(word *)no,(size_t)Va,stack);
      if (bVar1 != 0) {
        (*(code *)in_RDX->f->mod[9])((long)in_RDI + ((ulong)key >> 1),dest,in_RDX->f->mod,src);
        (*(code *)in_RDX->f->mod[9])
                  ((long)in_RDI + ((ulong)((long)key * 3) >> 1),(void *)((long)dest + (long)X * 8),
                   in_RDX->f->mod,src);
        memCopy(dest,src,0x1209a6);
        return 0;
      }
      return 0x1f6;
    }
  }
  return 0x6d;
}

Assistant:

err_t bakeBPACEStep3(octet out[], const octet in[], void* state)
{
	bake_bpace_o* s = (bake_bpace_o*)state;
	size_t n, no;
	// стек
	word* Va;			/* [2 * n] */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, no / 2) ||
		!memIsValid(out, 5 * no / 2))
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, 5 * no / 2, s, objKeep(s)));
	// раскладка стека
	Va = objEnd(s, word);
	stack = Va + 2 * n;
	// Rb <- beltECBDecr(Yb, K2)
	memCopy(s->R + no / 2, in, no / 2);
	beltECBStart(stack, s->K2, 32);
	beltECBStepD(s->R + no / 2, no / 2, stack);
	// Ra <-R {0, 1}^l
	s->settings->rng(out, no / 2, s->settings->rng_state);
	memCopy(s->R, out, no / 2);
	// out ||... <- beltECBEncr(Ra, K2)
	beltECBStart(stack, s->K2, 32);
	beltECBStepE(out, no / 2, stack);
	// W <- bakeSWU(Ra || Rb)
	bakeSWU2(s->W, s->ec, s->R, stack);
	// ua <-R {1, 2, ..., q - 1}
	if (!zzRandNZMod(s->u, s->ec->order, n, s->settings->rng,
		s->settings->rng_state))
		return ERR_BAD_RNG;
	// Va <- ua W
	if (!ecMulA(Va, s->W, s->ec, s->u, n, stack))
		return ERR_BAD_PARAMS;
	// ...|| out <- <Va>
	qrTo(out + no / 2, ecX(Va), s->ec->f, stack);
	qrTo(out + 3 * no / 2, ecY(Va, n), s->ec->f, stack);
	// сохранить x-координату Va
	memCopy(s->R, out + no / 2, no);
	// все нормально
	return ERR_OK;
}